

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_close(archive_write *a)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  undefined8 *puVar8;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  long lStack_50;
  ulong local_48;
  undefined8 uStack_40;
  
  pvVar1 = a->format_data;
  uVar2 = *(ulong *)((long)pvVar1 + 0x108);
  for (puVar8 = *(undefined8 **)((long)pvVar1 + 0xe8); puVar8 != (undefined8 *)0x0;
      puVar8 = (undefined8 *)*puVar8) {
    iVar4 = __archive_write_output(a,(void *)puVar8[2],puVar8[3] - (long)puVar8[2]);
    if (iVar4 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0x108) = *(long *)((long)pvVar1 + 0x108) + (puVar8[3] - puVar8[2]);
  }
  lVar3 = *(long *)((long)pvVar1 + 0x108);
  lVar6 = lVar3 - uVar2;
  if (((0xffffffff < (long)uVar2 || 0xffffffff < lVar6) ||
      (0xffff < *(ulong *)((long)pvVar1 + 0x100))) || ((*(byte *)((long)pvVar1 + 0x134) & 2) != 0))
  {
    local_68 = 0;
    local_78 = 0x6064b50;
    uStack_6f = 0;
    uStack_6e = 0;
    uStack_6d = 0;
    uStack_6c = 0x2d;
    uStack_6b = 0;
    uStack_6a = 0x2d;
    uStack_69 = 0;
    uStack_74 = 0x2c;
    uStack_70 = 0;
    uStack_60 = *(undefined8 *)((long)pvVar1 + 0x100);
    local_58 = uStack_60;
    lStack_50 = lVar6;
    local_48 = uVar2;
    iVar4 = __archive_write_output(a,&local_78,0x38);
    if (iVar4 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0x108) = *(long *)((long)pvVar1 + 0x108) + 0x38;
    local_78 = 0x7064b50;
    uStack_74 = 0;
    uStack_70 = (undefined1)lVar3;
    uStack_6f = (undefined1)((ulong)lVar3 >> 8);
    uStack_6e = (undefined1)((ulong)lVar3 >> 0x10);
    uStack_6d = (undefined1)((ulong)lVar3 >> 0x18);
    uStack_6c = (undefined1)((ulong)lVar3 >> 0x20);
    uStack_6b = (undefined1)((ulong)lVar3 >> 0x28);
    uStack_6a = (undefined1)((ulong)lVar3 >> 0x30);
    uStack_69 = (undefined1)((ulong)lVar3 >> 0x38);
    local_68 = CONCAT44(local_68._4_4_,1);
    iVar4 = __archive_write_output(a,&local_78,0x14);
    if (iVar4 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0x108) = *(long *)((long)pvVar1 + 0x108) + 0x14;
  }
  uStack_74 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  lStack_50 = 0;
  uStack_60 = 0;
  local_78 = 0x6054b50;
  uVar5 = 0xffff;
  if (*(ulong *)((long)pvVar1 + 0x100) < 0xffff) {
    uVar5 = *(ulong *)((long)pvVar1 + 0x100);
  }
  uStack_70 = (undefined1)uVar5;
  uStack_6f = (undefined1)(uVar5 >> 8);
  if (0xfffffffe < lVar6) {
    lVar6 = 0xffffffff;
  }
  uStack_6c = (undefined1)lVar6;
  uStack_6b = (undefined1)((ulong)lVar6 >> 8);
  uStack_6a = (undefined1)((ulong)lVar6 >> 0x10);
  local_68 = 0xffffffff;
  if ((long)uVar2 < 0xffffffff) {
    local_68 = uVar2;
  }
  uStack_69 = (undefined1)((ulong)lVar6 >> 0x18);
  local_68 = local_68 & 0xffffffff;
  uStack_6e = uStack_70;
  uStack_6d = uStack_6f;
  iVar4 = __archive_write_output(a,&local_78,0x16);
  iVar7 = -0x1e;
  if (iVar4 == 0) {
    *(long *)((long)pvVar1 + 0x108) = *(long *)((long)pvVar1 + 0x108) + 0x16;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int
archive_write_zip_close(struct archive_write *a)
{
	uint8_t buff[64];
	int64_t offset_start, offset_end;
	struct zip *zip = a->format_data;
	struct cd_segment *segment;
	int ret;

	offset_start = zip->written_bytes;
	segment = zip->central_directory;
	while (segment != NULL) {
		ret = __archive_write_output(a,
		    segment->buff, segment->p - segment->buff);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->written_bytes += segment->p - segment->buff;
		segment = segment->next;
	}
	offset_end = zip->written_bytes;

	/* If central dir info is too large, write Zip64 end-of-cd */
	if (offset_end - offset_start > ZIP_4GB_MAX
	    || offset_start > ZIP_4GB_MAX
	    || zip->central_directory_entries > 0xffffUL
	    || (zip->flags & ZIP_FLAG_FORCE_ZIP64)) {
	  /* Zip64 end-of-cd record */
	  memset(buff, 0, 56);
	  memcpy(buff, "PK\006\006", 4);
	  archive_le64enc(buff + 4, 44);
	  archive_le16enc(buff + 12, 45);
	  archive_le16enc(buff + 14, 45);
	  /* This is disk 0 of 0. */
	  archive_le64enc(buff + 24, zip->central_directory_entries);
	  archive_le64enc(buff + 32, zip->central_directory_entries);
	  archive_le64enc(buff + 40, offset_end - offset_start);
	  archive_le64enc(buff + 48, offset_start);
	  ret = __archive_write_output(a, buff, 56);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 56;

	  /* Zip64 end-of-cd locator record. */
	  memset(buff, 0, 20);
	  memcpy(buff, "PK\006\007", 4);
	  archive_le32enc(buff + 4, 0);
	  archive_le64enc(buff + 8, offset_end);
	  archive_le32enc(buff + 16, 1);
	  ret = __archive_write_output(a, buff, 20);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 20;
	}

	/* Format and write end of central directory. */
	memset(buff, 0, sizeof(buff));
	memcpy(buff, "PK\005\006", 4);
	archive_le16enc(buff + 8, (uint16_t)zipmin(0xffffU,
		zip->central_directory_entries));
	archive_le16enc(buff + 10, (uint16_t)zipmin(0xffffU,
		zip->central_directory_entries));
	archive_le32enc(buff + 12,
		(uint32_t)zipmin(ZIP_4GB_MAX, (offset_end - offset_start)));
	archive_le32enc(buff + 16,
		(uint32_t)zipmin(ZIP_4GB_MAX, offset_start));
	ret = __archive_write_output(a, buff, 22);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 22;
	return (ARCHIVE_OK);
}